

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeBase *
MatchGenericType(ExpressionContext *ctx,SynBase *source,TypeBase *matchType,TypeBase *argType,
                IntrusiveList<MatchData> *aliases,bool strict)

{
  SynIdentifier *pSVar1;
  longlong length;
  IntrusiveList<TypeHandle> arguments;
  bool bVar2;
  int iVar3;
  MatchData *pMVar4;
  TypeBase *pTVar5;
  TypeUnsizedArray *pTVar6;
  TypeUnsizedArray *pTVar7;
  TypeUnsizedArray *pTVar8;
  TypeBase *pTVar9;
  undefined4 extraout_var_00;
  undefined8 *puVar10;
  ScopeData *pSVar11;
  VariableData *pVVar12;
  IntrusiveList<MatchData> subAliases;
  TypeUnsizedArray *local_70;
  IntrusiveList<MatchData> local_58;
  TypeBase *local_40;
  TypeBase *local_38;
  TypeHandle *node;
  undefined4 extraout_var;
  
  if (matchType->isGeneric == false) {
    if (argType->isGeneric == true) {
      local_58.head = (MatchData *)0x0;
      local_58.tail = (MatchData *)0x0;
      pTVar9 = MatchGenericType(ctx,source,argType,matchType,&local_58,true);
      if (pTVar9 != (TypeBase *)0x0) {
        argType = pTVar9;
      }
    }
    pTVar9 = (TypeBase *)0x0;
    if (!strict) {
      pTVar9 = matchType;
    }
    if (argType == matchType) {
      return argType;
    }
    return pTVar9;
  }
  if (matchType != (TypeBase *)0x0) {
    if (matchType->typeID == 0xc) {
      if (!strict) {
        if ((argType == (TypeBase *)0x0) || (pTVar9 = argType, argType->typeID != 0x13)) {
          pTVar9 = (TypeBase *)0x0;
        }
        if (pTVar9 != (TypeBase *)0x0) {
          argType = (TypeBase *)
                    ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)pTVar9[1]._vptr_TypeBase)
          ;
        }
      }
      if ((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) {
        return (TypeBase *)0x0;
      }
      if ((((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0) {
        return (TypeBase *)(TypeUnsizedArray *)argType;
      }
      return (TypeBase *)0x0;
    }
    if ((matchType != (TypeBase *)0x0) && (pTVar9 = matchType, matchType->typeID == 0xd))
    goto LAB_00160837;
  }
  pTVar9 = (TypeBase *)0x0;
LAB_00160837:
  local_70 = (TypeUnsizedArray *)aliases;
  if (pTVar9 != (TypeBase *)0x0) {
    if (!strict) {
      if ((argType == (TypeBase *)0x0) || (pTVar5 = argType, argType->typeID != 0x13)) {
        pTVar5 = (TypeBase *)0x0;
      }
      if (pTVar5 != (TypeBase *)0x0) {
        argType = (TypeBase *)
                  ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)pTVar5[1]._vptr_TypeBase);
      }
    }
    for (pMVar4 = aliases->head; pMVar4 != (MatchData *)0x0; pMVar4 = pMVar4->next) {
      bVar2 = InplaceStr::operator==
                        (&pMVar4->name->name,(InplaceStr *)(pTVar9[1]._vptr_TypeBase + 8));
      if (bVar2) {
        if ((strict) && ((TypeUnsizedArray *)pMVar4->type != (TypeUnsizedArray *)argType)) {
          local_70 = (TypeUnsizedArray *)0x0;
        }
        else {
          local_70 = (TypeUnsizedArray *)pMVar4->type;
        }
        goto LAB_001608bd;
      }
    }
    local_70 = (TypeUnsizedArray *)0x0;
LAB_001608bd:
    if (pMVar4 == (MatchData *)0x0) {
      if (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) ||
         (((((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0 &&
          (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0 ||
           (((((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0x1b &&
            (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0 ||
             (((((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0x1c &&
              (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0 ||
               ((((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0x1a)))))
             ))))))))) {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pMVar4 = (MatchData *)CONCAT44(extraout_var,iVar3);
        pSVar1 = (SynIdentifier *)pTVar9[1]._vptr_TypeBase;
        pMVar4->name = pSVar1;
        pMVar4->type = argType;
        pMVar4->next = (MatchData *)0x0;
        pMVar4->listed = false;
        if (pSVar1 == (SynIdentifier *)0x0) {
          __assert_fail("name",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                        ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
        }
        IntrusiveList<MatchData>::push_back(aliases,pMVar4);
        local_70 = (TypeUnsizedArray *)argType;
      }
      else {
        local_70 = (TypeUnsizedArray *)0x0;
      }
    }
  }
  if (pTVar9 == (TypeBase *)0x0) {
    if ((matchType == (TypeBase *)0x0) || (pTVar9 = matchType, matchType->typeID != 0x12)) {
      pTVar9 = (TypeBase *)0x0;
    }
    if (pTVar9 != (TypeBase *)0x0) {
      if (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) ||
         (pTVar6 = (TypeUnsizedArray *)argType,
         (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0x12)) {
        pTVar6 = (TypeUnsizedArray *)0x0;
      }
      if ((pTVar6 == (TypeUnsizedArray *)0x0) ||
         (pTVar5 = MatchGenericType(ctx,source,(TypeBase *)pTVar9[1]._vptr_TypeBase,
                                    (TypeBase *)(pTVar6->super_TypeStruct).typeScope,aliases,true),
         pTVar5 == (TypeBase *)0x0)) {
        local_70 = (TypeUnsizedArray *)0x0;
      }
      else {
        local_70 = (TypeUnsizedArray *)ExpressionContext::GetReferenceType(ctx,pTVar5);
      }
      if (pTVar6 == (TypeUnsizedArray *)0x0 && !strict) {
        pTVar5 = MatchGenericType(ctx,source,(TypeBase *)pTVar9[1]._vptr_TypeBase,argType,aliases,
                                  true);
        if (pTVar5 == (TypeBase *)0x0) {
          local_70 = (TypeUnsizedArray *)0x0;
        }
        else {
          local_70 = (TypeUnsizedArray *)ExpressionContext::GetReferenceType(ctx,pTVar5);
        }
      }
    }
    if (pTVar9 == (TypeBase *)0x0) {
      if ((matchType == (TypeBase *)0x0) || (pTVar9 = matchType, matchType->typeID != 0x13)) {
        pTVar9 = (TypeBase *)0x0;
      }
      if (pTVar9 != (TypeBase *)0x0) {
        if (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) ||
           (pTVar6 = (TypeUnsizedArray *)argType,
           (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0x13)) {
          pTVar6 = (TypeUnsizedArray *)0x0;
        }
        if (((pTVar6 == (TypeUnsizedArray *)0x0) ||
            (*(MemberHandle **)&pTVar9[1].typeID != (pTVar6->super_TypeStruct).members.head)) ||
           (pTVar5 = MatchGenericType(ctx,source,(TypeBase *)pTVar9[1]._vptr_TypeBase,
                                      (TypeBase *)(pTVar6->super_TypeStruct).typeScope,aliases,true)
           , pTVar5 == (TypeBase *)0x0)) {
          local_70 = (TypeUnsizedArray *)0x0;
        }
        else {
          length._0_4_ = pTVar9[1].typeID;
          length._4_4_ = pTVar9[1].nameHash;
          local_70 = (TypeUnsizedArray *)ExpressionContext::GetArrayType(ctx,pTVar5,length);
        }
      }
      if (pTVar9 == (TypeBase *)0x0) {
        if ((matchType == (TypeBase *)0x0) || (pTVar9 = matchType, matchType->typeID != 0x14)) {
          pTVar9 = (TypeBase *)0x0;
        }
        if (pTVar9 != (TypeBase *)0x0) {
          if (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) ||
             (pTVar6 = (TypeUnsizedArray *)argType,
             (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0x14)) {
            pTVar6 = (TypeUnsizedArray *)0x0;
          }
          if (pTVar6 == (TypeUnsizedArray *)0x0) {
            pTVar7 = (TypeUnsizedArray *)0x0;
            pTVar8 = local_70;
          }
          else {
            pTVar5 = MatchGenericType(ctx,source,*(TypeBase **)&pTVar9[1].typeIndex,pTVar6->subType,
                                      aliases,true);
            if (pTVar5 == (TypeBase *)0x0) {
              pTVar7 = (TypeUnsizedArray *)0x0;
              pTVar8 = (TypeUnsizedArray *)0x0;
            }
            else {
              pTVar7 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar5);
              pTVar8 = pTVar7;
            }
          }
          local_70 = pTVar7;
          if (pTVar6 == (TypeUnsizedArray *)0x0 && !strict) {
            if (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) ||
               (pTVar6 = (TypeUnsizedArray *)argType,
               (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0x13)) {
              pTVar6 = (TypeUnsizedArray *)0x0;
            }
            if (pTVar6 == (TypeUnsizedArray *)0x0) {
              bVar2 = true;
            }
            else {
              pTVar5 = MatchGenericType(ctx,source,*(TypeBase **)&pTVar9[1].typeIndex,
                                        (TypeBase *)(pTVar6->super_TypeStruct).typeScope,aliases,
                                        true);
              bVar2 = pTVar5 == (TypeBase *)0x0;
              if (!bVar2) {
                pTVar8 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar5);
              }
            }
            local_70 = (TypeUnsizedArray *)0x0;
            if (!bVar2) {
              local_70 = pTVar8;
            }
          }
        }
        if (pTVar9 == (TypeBase *)0x0) {
          if ((matchType == (TypeBase *)0x0) || (pTVar9 = matchType, matchType->typeID != 0x15)) {
            pTVar9 = (TypeBase *)0x0;
          }
          if (pTVar9 != (TypeBase *)0x0) {
            if (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) ||
               (pTVar6 = (TypeUnsizedArray *)argType,
               (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0x15)) {
              pTVar6 = (TypeUnsizedArray *)0x0;
            }
            if ((pTVar6 == (TypeUnsizedArray *)0x0) ||
               (pTVar5 = MatchGenericType(ctx,source,(TypeBase *)pTVar9[1]._vptr_TypeBase,
                                          (TypeBase *)(pTVar6->super_TypeStruct).typeScope,aliases,
                                          true), pTVar5 == (TypeBase *)0x0)) {
              local_70 = (TypeUnsizedArray *)0x0;
            }
            else {
              local_58.head = (MatchData *)0x0;
              local_58.tail = (MatchData *)0x0;
              puVar10 = *(undefined8 **)&pTVar9[1].typeID;
              local_40 = pTVar5;
              local_38 = pTVar9;
              for (pVVar12 = (VariableData *)(pTVar6->super_TypeStruct).members.head;
                  (puVar10 != (undefined8 *)0x0 && (pVVar12 != (VariableData *)0x0));
                  pVVar12 = (VariableData *)pVVar12->importModule) {
                pTVar9 = MatchGenericType(ctx,source,(TypeBase *)*puVar10,
                                          (TypeBase *)pVVar12->source,aliases,true);
                if (pTVar9 == (TypeBase *)0x0) {
                  local_70 = (TypeUnsizedArray *)0x0;
                  pTVar9 = local_38;
                  goto LAB_00160cdb;
                }
                iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
                node = (TypeHandle *)CONCAT44(extraout_var_00,iVar3);
                node->type = pTVar9;
                node->next = (TypeHandle *)0x0;
                node->listed = false;
                IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&local_58,node);
                puVar10 = (undefined8 *)puVar10[1];
              }
              if (puVar10 == (undefined8 *)0x0 && pVVar12 == (VariableData *)0x0) {
                arguments.tail = (TypeHandle *)local_58.tail;
                arguments.head = (TypeHandle *)local_58.head;
                local_70 = (TypeUnsizedArray *)
                           ExpressionContext::GetFunctionType(ctx,source,local_40,arguments);
                pTVar9 = local_38;
              }
              else {
                local_70 = (TypeUnsizedArray *)0x0;
                pTVar9 = local_38;
              }
            }
          }
LAB_00160cdb:
          if (pTVar9 == (TypeBase *)0x0) {
            if ((matchType == (TypeBase *)0x0) || (pTVar9 = matchType, matchType->typeID != 0x17)) {
              pTVar9 = (TypeBase *)0x0;
            }
            if (pTVar9 != (TypeBase *)0x0) {
              if (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) ||
                 (pTVar6 = (TypeUnsizedArray *)argType,
                 (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
                pTVar6 = (TypeUnsizedArray *)0x0;
              }
              if ((pTVar6 == (TypeUnsizedArray *)0x0) ||
                 ((TypeUnsizedArray *)pTVar9[1]._vptr_TypeBase !=
                  pTVar6[1].super_TypeStruct.super_TypeBase.unsizedArrayType)) {
                local_70 = (TypeUnsizedArray *)0x0;
              }
              else {
                puVar10 = *(undefined8 **)&pTVar9[1].typeID;
                pSVar11 = pTVar6[1].super_TypeStruct.typeScope;
                while( true ) {
                  local_70 = (TypeUnsizedArray *)argType;
                  if ((puVar10 == (undefined8 *)0x0) || (pSVar11 == (ScopeData *)0x0))
                  goto LAB_00160d24;
                  pTVar5 = MatchGenericType(ctx,source,(TypeBase *)*puVar10,
                                            *(TypeBase **)&pSVar11->uniqueId,aliases,true);
                  if (pTVar5 == (TypeBase *)0x0) break;
                  puVar10 = (undefined8 *)puVar10[1];
                  pSVar11 = (ScopeData *)pSVar11->ownerNamespace;
                }
                local_70 = (TypeUnsizedArray *)0x0;
              }
            }
LAB_00160d24:
            if (pTVar9 == (TypeBase *)0x0) {
              if ((matchType == (TypeBase *)0x0) || (matchType->typeID != 0x16)) {
                matchType = (TypeBase *)0x0;
              }
              if ((TypeUnsizedArray *)matchType != (TypeUnsizedArray *)0x0) {
                if (((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) ||
                   (pTVar6 = (TypeUnsizedArray *)argType,
                   (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID != 0x18))
                {
                  pTVar6 = (TypeUnsizedArray *)0x0;
                }
                local_70 = (TypeUnsizedArray *)0x0;
                if ((pTVar6 != (TypeUnsizedArray *)0x0) &&
                   ((TypeUnsizedArray *)matchType ==
                    pTVar6[1].super_TypeStruct.super_TypeBase.unsizedArrayType)) {
                  local_70 = (TypeUnsizedArray *)argType;
                }
              }
              if ((TypeUnsizedArray *)matchType == (TypeUnsizedArray *)0x0) {
                anon_unknown.dwarf_c6b42::Stop(ctx,source,"ERROR: unknown generic type match");
              }
            }
          }
        }
      }
    }
  }
  return (TypeBase *)local_70;
}

Assistant:

TypeBase* MatchGenericType(ExpressionContext &ctx, SynBase *source, TypeBase *matchType, TypeBase *argType, IntrusiveList<MatchData> &aliases, bool strict)
{
	if(!matchType->isGeneric)
	{
		if(argType->isGeneric)
		{
			IntrusiveList<MatchData> subAliases;

			if(TypeBase *improved = MatchGenericType(ctx, source, argType, matchType, subAliases, true))
				argType = improved;
		}

		if(matchType == argType)
			return argType;

		if(strict)
			return NULL;

		return matchType;
	}

	// 'generic' match with 'type' results with 'type'
	if(isType<TypeGeneric>(matchType))
	{
		if(!strict)
		{
			// 'generic' match with 'type[N]' results with 'type[]'
			if(TypeArray *rhs = getType<TypeArray>(argType))
				argType = ctx.GetUnsizedArrayType(rhs->subType);
		}

		if(isType<TypeError>(argType))
			return NULL;

		return argType;
	}

	if(TypeGenericAlias *lhs = getType<TypeGenericAlias>(matchType))
	{
		if(!strict)
		{
			// 'generic' match with 'type[N]' results with 'type[]'
			if(TypeArray *rhs = getType<TypeArray>(argType))
				argType = ctx.GetUnsizedArrayType(rhs->subType);
		}

		for(MatchData *curr = aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name == lhs->baseName->name)
			{
				if(strict)
				{
					if(curr->type != argType)
						return NULL;
				}

				return curr->type;
			}
		}

		if(isType<TypeError>(argType))
			return NULL;

		if(isType<TypeArgumentSet>(argType) || isType<TypeMemberSet>(argType) || isType<TypeFunctionSet>(argType))
			return NULL;

		aliases.push_back(new (ctx.get<MatchData>()) MatchData(lhs->baseName, argType));

		return argType;
	}

	if(TypeRef *lhs = getType<TypeRef>(matchType))
	{
		// 'generic ref' match with 'type ref' results with 'type ref'
		if(TypeRef *rhs = getType<TypeRef>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetReferenceType(match);

			return NULL;
		}

		if(strict)
			return NULL;

		// 'generic ref' match with 'type' results with 'type ref'
		if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, argType, aliases, true))
			return ctx.GetReferenceType(match);

		return NULL;
	}

	if(TypeArray *lhs = getType<TypeArray>(matchType))
	{
		// Only match with arrays of the same size
		if(TypeArray *rhs = getType<TypeArray>(argType))
		{
			if(lhs->length == rhs->length)
			{
				if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
					return ctx.GetArrayType(match, lhs->length);

				return NULL;
			}
		}

		return NULL;
	}

	if(TypeUnsizedArray *lhs = getType<TypeUnsizedArray>(matchType))
	{
		// 'generic[]' match with 'type[]' results with 'type[]'
		if(TypeUnsizedArray *rhs = getType<TypeUnsizedArray>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetUnsizedArrayType(match);

			return NULL;
		}

		if(strict)
			return NULL;

		// 'generic[]' match with 'type[N]' results with 'type[]'
		if(TypeArray *rhs = getType<TypeArray>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetUnsizedArrayType(match);
		}

		return NULL;
	}

	if(TypeFunction *lhs = getType<TypeFunction>(matchType))
	{
		// Only match with other function type
		if(TypeFunction *rhs = getType<TypeFunction>(argType))
		{
			TypeBase *returnType = MatchGenericType(ctx, source, lhs->returnType, rhs->returnType, aliases, true);

			if(!returnType)
				return NULL;

			IntrusiveList<TypeHandle> arguments;

			TypeHandle *lhsArg = lhs->arguments.head;
			TypeHandle *rhsArg = rhs->arguments.head;

			while(lhsArg && rhsArg)
			{
				TypeBase *argMatched = MatchGenericType(ctx, source, lhsArg->type, rhsArg->type, aliases, true);

				if(!argMatched)
					return NULL;

				arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argMatched));

				lhsArg = lhsArg->next;
				rhsArg = rhsArg->next;
			}

			// Different number of arguments
			if(lhsArg || rhsArg)
				return NULL;

			return ctx.GetFunctionType(source, returnType, arguments);
		}

		return NULL;
	}

	if(TypeGenericClass *lhs = getType<TypeGenericClass>(matchType))
	{
		// Match with a generic class instance
		if(TypeClass *rhs = getType<TypeClass>(argType))
		{
			if(lhs->proto != rhs->proto)
				return NULL;

			TypeHandle *lhsArg = lhs->generics.head;
			MatchData *rhsArg = rhs->generics.head;

			while(lhsArg && rhsArg)
			{
				TypeBase *argMatched = MatchGenericType(ctx, source, lhsArg->type, rhsArg->type, aliases, true);

				if(!argMatched)
					return NULL;

				lhsArg = lhsArg->next;
				rhsArg = rhsArg->next;
			}

			return argType;
		}

		return NULL;
	}

	if(TypeGenericClassProto *lhs = getType<TypeGenericClassProto>(matchType))
	{
		// Match with a generic class instance
		if(TypeClass *rhs = getType<TypeClass>(argType))
		{
			if(lhs != rhs->proto)
				return NULL;

			return argType;
		}

		return NULL;
	}

	Stop(ctx, source, "ERROR: unknown generic type match");

	return NULL;
}